

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
::init(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
       *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  DrawMethod DVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  int numBytes;
  int numBytes_00;
  int numBytes_01;
  int numBytes_02;
  int numBytes_03;
  long lVar12;
  sbyte sVar13;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  char *__s;
  char *pcVar17;
  bool bVar18;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  string local_290;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ,ctx);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  iVar5 = *(int *)&(this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                   ).field_0xcc;
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  sVar13 = (iVar5 != 1) * '\x03' + 2;
  iVar5 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  uVar2 = ((iVar5 << sVar13) >> 1) + 3U & 0xfffffffc;
  uVar3 = ((iVar4 << sVar13) >> 1) + 3U & 0xfffffffc;
  if (this->m_uploadRange == UPLOADRANGE_FULL) {
    uVar2 = iVar5 << sVar13;
    uVar3 = iVar4 << sVar13;
  }
  local_1b0._0_8_ =
       ((this->
        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>)
        .super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Measuring the time used in ",0x1b);
  bVar18 = DVar1 != DRAWMETHOD_DRAW_ARRAYS;
  pcVar14 = "drawElements";
  if (!bVar18) {
    pcVar14 = "drawArrays";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar14,(ulong)bVar18 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," and readPixels call with different rendering workloads.\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"The ",4);
  bVar18 = *(int *)&(this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                    ).field_0xcc != 1;
  pcVar14 = "vertex attrib";
  if (!bVar18) {
    pcVar14 = "index";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar14,(ulong)bVar18 * 8 + 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," buffer ",8);
  bVar18 = this->m_bufferState != BUFFERSTATE_NEW;
  pcVar17 = "";
  pcVar14 = "contents ";
  if (!bVar18) {
    pcVar14 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,(ulong)bVar18 * 9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"sourced by the rendering command ",0x21);
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar14 = "is uploaded ";
  }
  else if (this->m_uploadRange == UPLOADRANGE_FULL) {
    pcVar14 = "are specified ";
  }
  else {
    pcVar14 = (char *)(ulong)(uint)(0 << sVar13);
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar14 = "are updated (partial upload) ";
    }
  }
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
  }
  else {
    sVar7 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"just before issuing the rendering command.\n",0x2b);
  bVar18 = this->m_bufferState != BUFFERSTATE_EXISTING;
  pcVar14 = "The buffer is generated just before uploading.\n";
  if (!bVar18) {
    pcVar14 = "The buffer has been used in rendering.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar14,(ulong)bVar18 * 8 + 0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Buffer ",7);
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar14 = "is uploaded";
  }
  else if (this->m_uploadRange == UPLOADRANGE_FULL) {
    pcVar14 = "contents are specified";
  }
  else {
    pcVar14 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar14 = "contents are partially updated";
    }
  }
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
  }
  else {
    sVar7 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," with ",6);
  pcVar14 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar14 = "bufferSubData";
  }
  __s = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    __s = pcVar14;
  }
  sVar7 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," command. Usage of the target buffer is DYNAMIC_DRAW.\n",0x36);
  bVar18 = this->m_uploadMethod != UPLOADMETHOD_MAP_BUFFER_RANGE;
  pcVar14 = 
  "Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n"
  ;
  if (bVar18) {
    pcVar14 = "";
  }
  lVar12 = 0x77;
  if (bVar18) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,lVar12);
  bVar18 = this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX;
  pcVar14 = 
  "Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n";
  if (bVar18) {
    pcVar14 = "";
  }
  lVar12 = 0x59;
  if (bVar18) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,lVar12);
  std::ostream::operator<<
            (this_00,(int)((ulong)((long)(this->
                                         super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                                         ).m_results.
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                                        ).m_results.
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x33333333);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," test samples. Sample order is randomized.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Workload sizes are in the range [",0x21);
  iVar6 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",  ",3);
  iVar6 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] vertices ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"([",2);
  iVar6 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)(iVar6 << 5),numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
  iVar6 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                            );
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)(ulong)(uint)(iVar6 << 5),numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"] to be processed).\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Upload sizes are in the range [",0x1f);
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_230,(_anonymous_namespace_ *)(ulong)uVar3,numBytes_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)(ulong)uVar2,numBytes_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].\n",3);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar1 != DRAWMETHOD_DRAW_ELEMENTS) {
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
    goto LAB_0075ee45;
  }
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes_03);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0xb5dc7c);
  local_270 = &local_260;
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_260 = *plVar10;
    lStack_258 = plVar8[3];
  }
  else {
    local_260 = *plVar10;
    local_270 = (long *)*plVar8;
  }
  local_268 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_2c0 = *puVar11;
    lStack_2b8 = plVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar11;
    local_2d0 = (ulong *)*plVar8;
  }
  local_2c8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)(ulong)(uint)(iVar5 << 5),(int)local_2c8);
  uVar15 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar15 = local_2c0;
  }
  if (uVar15 < local_290._M_string_length + local_2c8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar16 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_290._M_string_length + local_2c8) goto LAB_0075ed89;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_0075ed89:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
  }
  local_2f0 = &local_2e0;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_2e0 = *plVar8;
    uStack_2d8 = puVar9[3];
  }
  else {
    local_2e0 = *plVar8;
    local_2f0 = (long *)*puVar9;
  }
  local_2e8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_2b0 = &local_2a0;
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_2a0 = *plVar10;
    lStack_298 = plVar8[3];
  }
  else {
    local_2a0 = *plVar10;
    local_2b0 = (long *)*plVar8;
  }
  local_2a8 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
LAB_0075ee45:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_2b0,local_2a8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Test result is the approximated processing rate in MiB / s.\n",0x3c
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Note that while upload time is measured, the time used is not included in the results.\n"
             ,0x57);
  bVar18 = this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX;
  pcVar14 = 
  "Note that the data size and the time used in the unrelated upload is not included in the results.\n"
  ;
  if (bVar18) {
    pcVar14 = "";
  }
  lVar12 = 0x62;
  if (bVar18) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,lVar12);
  bVar18 = (this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS;
  if (bVar18) {
    pcVar17 = "Note that index array size is not included in the processed size.\n";
  }
  lVar12 = 0x42;
  if (!bVar18) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar17,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
             ,0x92);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (DVar1 == DRAWMETHOD_DRAW_ELEMENTS) {
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar5 = std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return iVar5;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::init (void)
{
	// init parent
	RenderCase<SampleType>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const int			perVertexSize			= (m_targetBuffer == TARGETBUFFER_INDEX) ? ((int)sizeof(deUint32)) : ((int)sizeof(tcu::Vec4[2]));
		const int			fullMinUploadSize		= RenderCase<SampleType>::getMinWorkloadSize() * perVertexSize;
		const int			fullMaxUploadSize		= RenderCase<SampleType>::getMaxWorkloadSize() * perVertexSize;
		const int			minUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMinUploadSize) : (deAlign32(fullMinUploadSize/2, 4));
		const int			maxUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMaxUploadSize) : (deAlign32(fullMaxUploadSize/2, 4));
		const int			minUnrelatedUploadSize	= RenderCase<SampleType>::getMinWorkloadSize() * (int)sizeof(tcu::Vec4[2]);
		const int			maxUnrelatedUploadSize	= RenderCase<SampleType>::getMaxWorkloadSize() * (int)sizeof(tcu::Vec4[2]);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
			<< "The "
				<< ((m_targetBuffer == TARGETBUFFER_INDEX) ? ("index") : ("vertex attrib"))
				<< " buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW) ? ("") : ("contents "))
				<< "sourced by the rendering command "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded ") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("are specified ") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("are updated (partial upload) ") :
					((const char*)DE_NULL))
				<< "just before issuing the rendering command.\n"
			<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("The buffer has been used in rendering.\n") : ("The buffer is generated just before uploading.\n"))
			<< "Buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("contents are specified") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("contents are partially updated") :
					((const char*)DE_NULL))
				<< " with "
				<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange"))
				<< " command. Usage of the target buffer is DYNAMIC_DRAW.\n"
			<< ((m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) ? ("Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n") : (""))
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n") : (""))
			<< RenderCase<SampleType>::getNumSamples() << " test samples. Sample order is randomized.\n"
			<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
			<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
			<< "Workload sizes are in the range ["
				<< RenderCase<SampleType>::getMinWorkloadSize() << ",  "
				<< RenderCase<SampleType>::getMaxWorkloadSize() << "] vertices "
				<< "(["
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMinWorkloadDataSize()) << ","
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMaxWorkloadDataSize()) << "] to be processed).\n"
			<< "Upload sizes are in the range ["
				<< getHumanReadableByteSize(minUploadSize) << ","
				<< getHumanReadableByteSize(maxUploadSize) << "].\n"
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ?
				("Unrelated upload sizes are in the range [" + getHumanReadableByteSize(minUnrelatedUploadSize) + ", " + getHumanReadableByteSize(maxUnrelatedUploadSize) + "]\n") :
				(""))
			<< "Test result is the approximated processing rate in MiB / s.\n"
			<< "Note that while upload time is measured, the time used is not included in the results.\n"
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Note that the data size and the time used in the unrelated upload is not included in the results.\n") : (""))
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
			<< "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
			<< tcu::TestLog::EndMessage;
	}
}